

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_resolve_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  JSValue *pJVar1;
  JSValueUnion *pJVar2;
  JSRuntime *pJVar3;
  BOOL BVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  ulong uVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue value;
  JSValue this_obj;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  pJVar2 = *(JSValueUnion **)((long)func_obj.u.ptr + 0x30);
  if ((pJVar2 == (JSValueUnion *)0x0) || (*(int *)((long)pJVar2[2].ptr + 4) != 0))
  goto LAB_00131141;
  *(undefined4 *)((long)pJVar2[2].ptr + 4) = 1;
  iVar7 = *(ushort *)((long)func_obj.u.ptr + 6) - 0x2b;
  if (argc < 1) {
    iVar9 = 3;
    uVar6 = 0;
    uVar10 = 0;
  }
  else {
    iVar9 = argv->tag;
    uVar10 = (ulong)(argv->u).ptr & 0xffffffff00000000;
    uVar6 = (ulong)(argv->u).ptr & 0xffffffff;
  }
  if ((iVar7 == 0) && ((int)iVar9 == -1)) {
    JVar8.ptr = (void *)(uVar10 | uVar6);
    JVar12.tag = iVar9;
    JVar12.u.ptr = JVar8.ptr;
    BVar4 = js_same_value(ctx,JVar12,*(JSValue *)pJVar2);
    if (BVar4 == 0) {
      JVar11.tag = iVar9;
      JVar11.u.ptr = JVar8.ptr;
      this_obj.tag = iVar9;
      this_obj.u.ptr = JVar8.ptr;
      JVar12 = JS_GetPropertyInternal(ctx,JVar11,0x7f,this_obj,0);
      if ((int)JVar12.tag != 6) {
        iVar5 = JS_IsFunction(ctx,JVar12);
        if (iVar5 != 0) {
          local_68 = *pJVar2;
          JStack_60 = pJVar2[1];
          local_58.ptr = JVar8.ptr;
          local_50 = iVar9;
          local_48 = JVar12;
          JS_EnqueueJob(ctx,js_promise_resolve_thenable_job,3,(JSValue *)&local_68);
          JS_FreeValue(ctx,JVar12);
          goto LAB_00131141;
        }
        JS_FreeValue(ctx,JVar12);
        goto LAB_00131125;
      }
    }
    else {
      JS_ThrowTypeError(ctx,"promise self resolution");
    }
    pJVar3 = ctx->rt;
    pJVar1 = &pJVar3->current_exception;
    JVar8 = (JSValueUnion)(pJVar1->u).ptr;
    iVar9 = (pJVar3->current_exception).tag;
    JVar11 = *pJVar1;
    JVar12 = *pJVar1;
    (pJVar3->current_exception).u.int32 = 0;
    (pJVar3->current_exception).tag = 2;
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar2,JVar12,1);
    if ((0xfffffff4 < (uint)iVar9) &&
       (iVar7 = *JVar8.ptr, *(int *)JVar8.ptr = iVar7 + -1, iVar7 < 2)) {
      local_68 = JVar8;
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
  }
  else {
LAB_00131125:
    value.tag = iVar9;
    value.u.ptr = (void *)(uVar10 | uVar6);
    fulfill_or_reject_promise(ctx,*(JSValue *)pJVar2,value,iVar7);
  }
LAB_00131141:
  return (JSValue)(ZEXT816(3) << 0x40);
}

Assistant:

static JSValue js_promise_resolve_function_call(JSContext *ctx,
                                                JSValueConst func_obj,
                                                JSValueConst this_val,
                                                int argc, JSValueConst *argv,
                                                int flags)
{
    JSObject *p = JS_VALUE_GET_OBJ(func_obj);
    JSPromiseFunctionData *s;
    JSValueConst resolution, args[3];
    JSValue then;
    BOOL is_reject;

    s = p->u.promise_function_data;
    if (!s || s->presolved->already_resolved)
        return JS_UNDEFINED;
    s->presolved->already_resolved = TRUE;
    is_reject = p->class_id - JS_CLASS_PROMISE_RESOLVE_FUNCTION;
    if (argc > 0)
        resolution = argv[0];
    else
        resolution = JS_UNDEFINED;
#ifdef DUMP_PROMISE
    printf("js_promise_resolving_function_call: is_reject=%d resolution=", is_reject);
    JS_DumpValue(ctx, resolution);
    printf("\n");
#endif
    if (is_reject || !JS_IsObject(resolution)) {
        goto done;
    } else if (js_same_value(ctx, resolution, s->promise)) {
        JS_ThrowTypeError(ctx, "promise self resolution");
        goto fail_reject;
    }
    then = JS_GetProperty(ctx, resolution, JS_ATOM_then);
    if (JS_IsException(then)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        reject_promise(ctx, s->promise, error);
        JS_FreeValue(ctx, error);
    } else if (!JS_IsFunction(ctx, then)) {
        JS_FreeValue(ctx, then);
    done:
        fulfill_or_reject_promise(ctx, s->promise, resolution, is_reject);
    } else {
        args[0] = s->promise;
        args[1] = resolution;
        args[2] = then;
        JS_EnqueueJob(ctx, js_promise_resolve_thenable_job, 3, args);
        JS_FreeValue(ctx, then);
    }
    return JS_UNDEFINED;
}